

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O2

fy_atom * fy_fill_atom(fy_parser *fyp,int advance,fy_atom *handle)

{
  int iVar1;
  _Bool _Var2;
  uint c;
  int iVar3;
  size_t advance_00;
  bool bVar4;
  
  fy_fill_atom_start(fyp,handle);
  if (0 < advance) {
    while (bVar4 = advance != 0, advance = advance + -1, bVar4) {
      c = fy_parse_peek(fyp);
      if ((int)c < 0) break;
      advance_00 = 1;
      if ((0x7f < c) && (advance_00 = 2, 0x7ff < c)) {
        advance_00 = 4 - (ulong)(c < 0x10000);
      }
      fy_advance_octets(fyp,advance_00);
      if (c == 0xd) {
        iVar3 = fy_parse_peek(fyp);
        if (iVar3 != 10) goto LAB_00139154;
        fy_advance_octets(fyp,1);
LAB_00139163:
        fyp->column = 0;
        fyp->nontab_column = 0;
        fyp->line = fyp->line + 1;
      }
      else {
LAB_00139154:
        _Var2 = fyp_is_lb(fyp,c);
        if (_Var2) goto LAB_00139163;
        iVar3 = fyp->column;
        iVar1 = fyp->tabsize;
        if (c == 9 && iVar1 != 0) {
          iVar3 = (iVar3 + iVar1) - iVar3 % iVar1;
        }
        else {
          iVar3 = iVar3 + 1;
        }
        fyp->column = iVar3;
        fyp->nontab_column = fyp->nontab_column + 1;
      }
    }
  }
  fy_fill_atom_end(fyp,handle);
  return handle;
}

Assistant:

struct fy_atom *fy_fill_atom(struct fy_parser *fyp, int advance, struct fy_atom *handle) {
    /* start mark */
    fy_fill_atom_start(fyp, handle);

    /* advance the given number of characters */
    if (advance > 0)
        fy_advance_by(fyp, advance);

    fy_fill_atom_end(fyp, handle);

    return handle;
}